

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  Arena **ppAVar1;
  byte bVar2;
  undefined1 *puVar3;
  RepeatedPtrField<google::protobuf::MessageLite> *this_00;
  ulong uVar4;
  
  bVar2 = this->type;
  if (this->is_repeated != true) {
    if ((byte)(bVar2 - 0x13) < 0xee) goto LAB_00289e5d;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) == 10) {
      if ((long *)(this->field_0).int64_t_value == (long *)0x0) {
        return;
      }
      (**(code **)(*(long *)(this->field_0).int64_t_value + 8))();
      return;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 9) {
      return;
    }
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    puVar3 = (undefined1 *)
             (((anon_union_16_2_b9f6da03_for_SooRep_0 *)
              &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_)->long_rep).elements_int;
    ppAVar1 = &(this_00->super_RepeatedPtrFieldBase).arena_;
    if ((Arena **)puVar3 != ppAVar1) {
      operator_delete(puVar3,(ulong)((long)&((*ppAVar1)->impl_).tag_and_id_ + 1));
    }
    uVar4 = 0x20;
    goto LAB_00289e2b;
  }
  if ((byte)(bVar2 - 0x13) < 0xee) {
    Free((Extension *)&stack0xffffffffffffffe8);
LAB_00289e5d:
    Free((Extension *)&stack0xffffffffffffffe8);
  }
  switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4)) {
  case 1:
  case 8:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
    break;
  case 2:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
    break;
  case 3:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
    break;
  case 4:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
    break;
  case 5:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
    break;
  case 6:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
    break;
  case 7:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
    break;
  case 9:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
    goto LAB_00289e48;
  case 10:
    this_00 = (RepeatedPtrField<google::protobuf::MessageLite> *)(this->field_0).int64_t_value;
    if (this_00 == (RepeatedPtrField<google::protobuf::MessageLite> *)0x0) {
      return;
    }
    RepeatedPtrField<google::protobuf::MessageLite>::~RepeatedPtrField(this_00);
LAB_00289e48:
    uVar4 = 0x18;
    goto LAB_00289e2b;
  default:
    return;
  }
  uVar4 = 0x10;
LAB_00289e2b:
  operator_delete(this_00,uVar4);
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)    \
  case WireFormatLite::CPPTYPE_##UPPERCASE:  \
    delete ptr.repeated_##LOWERCASE##_value; \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete ptr.string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete ptr.lazymessage_value;
        } else {
          delete ptr.message_value;
        }
        break;
      default:
        break;
    }
  }
}